

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

void protect_enter(refs_table_t *tbl)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint32_t v;
  refs_table_t *tbl_local;
  
  do {
    while (uVar1 = tbl->refs_control, (uVar1 & 0xf0000000) != 0) {
      do {
        iVar2 = protect_resize_help(tbl);
      } while (iVar2 != 0);
    }
    LOCK();
    bVar3 = uVar1 == tbl->refs_control;
    if (bVar3) {
      tbl->refs_control = uVar1 + 1;
    }
    UNLOCK();
  } while (!bVar3);
  return;
}

Assistant:

static inline void
protect_enter(refs_table_t *tbl)
{
    for (;;) {
        uint32_t v = tbl->refs_control;
        if (v & 0xf0000000) {
            while (protect_resize_help(tbl)) continue;
        } else {
            if (atomic_compare_exchange_weak(&tbl->refs_control, &v, v+1)) return;
        }
    }
}